

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O3

void __thiscall
SQASTWritingVisitor::writeExprVector
          (SQASTWritingVisitor *this,ArenaVector<SQCompilation::Expr_*> *v)

{
  uint uVar1;
  OutputStream *pOVar2;
  Expr **ppEVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  pOVar2 = this->stream;
  uVar5 = (ulong)v->_size;
  uVar6 = uVar5;
  if (0x7f < uVar5) {
    do {
      (**pOVar2->_vptr_OutputStream)(pOVar2,(ulong)(byte)((byte)uVar5 | 0x80));
      uVar6 = uVar5 >> 7;
      bVar4 = 0x3fff < uVar5;
      uVar5 = uVar6;
    } while (bVar4);
  }
  (**pOVar2->_vptr_OutputStream)(pOVar2,uVar6 & 0xff);
  uVar1 = v->_size;
  if ((ulong)uVar1 != 0) {
    ppEVar3 = v->_vals;
    lVar7 = 0;
    do {
      SQCompilation::Node::visit<SQASTWritingVisitor>(*(Node **)((long)ppEVar3 + lVar7),this);
      lVar7 = lVar7 + 8;
    } while ((ulong)uVar1 << 3 != lVar7);
  }
  return;
}

Assistant:

void SQASTWritingVisitor::writeExprVector(const ArenaVector<Expr *> &v) {
  stream->writeUInt64(v.size());

  for (auto e : v) {
    e->visit(this);
  }
}